

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O0

string_ref * __thiscall
system_error2::_generic_code_domain::name
          (string_ref *__return_storage_ptr__,_generic_code_domain *this)

{
  _generic_code_domain *this_local;
  
  status_code_domain::string_ref::string_ref
            (__return_storage_ptr__,"generic domain",0xffffffffffffffff,(void *)0x0,(void *)0x0,
             (void *)0x0,status_code_domain::string_ref::_checking_string_thunk);
  return __return_storage_ptr__;
}

Assistant:

virtual _base::string_ref name() const noexcept override { return string_ref("generic domain"); }